

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O2

nhrect * get_rect(nhrect *r)

{
  nhrect *pnVar1;
  int iVar2;
  
  pnVar1 = rect;
  iVar2 = 0;
  while( true ) {
    if (rect_cnt <= iVar2) {
      return (nhrect *)0x0;
    }
    if ((((pnVar1->lx <= r->lx) && (pnVar1->ly <= r->ly)) && (r->hx <= pnVar1->hx)) &&
       (r->hy <= pnVar1->hy)) break;
    iVar2 = iVar2 + 1;
    pnVar1 = pnVar1 + 1;
  }
  return pnVar1;
}

Assistant:

struct nhrect *get_rect(struct nhrect *r)
{
	struct nhrect *rectp;
	int lx, ly, hx, hy;
	int i;

	lx = r->lx; ly = r->ly;
	hx = r->hx; hy = r->hy;
	for (i=0,rectp = &rect[0];i<rect_cnt;i++,rectp++)
	    if ( lx >= rectp->lx && ly >= rectp->ly &&
		 hx <= rectp->hx && hy <= rectp->hy)
		return rectp;
	return 0;
}